

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstring.cc
# Opt level: O1

int bd_sprintf(string *str,char *fmt,...)

{
  char *pcVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buffer;
  va_list ap;
  char *local_100;
  undefined8 local_f8;
  char **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_e8 = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_100 = (char *)0x0;
  local_f0 = &buffer;
  local_f8 = 0x3000000010;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  iVar3 = vasprintf(&local_100,fmt,&local_f8);
  pcVar2 = local_100;
  if ((iVar3 < 0) || (local_100 == (char *)0x0)) {
    str->_M_string_length = 0;
    *(str->_M_dataplus)._M_p = '\0';
  }
  else {
    pcVar1 = (char *)str->_M_string_length;
    strlen(local_100);
    std::__cxx11::string::_M_replace((ulong)str,0,pcVar1,(ulong)pcVar2);
    free(local_100);
  }
  return iVar3;
}

Assistant:

int bd_sprintf(std::string &str, const char *fmt, ...) {
	char *buffer = NULL;
	va_list ap;

	va_start(ap, fmt);
	int retval = vasprintf(&buffer, fmt, ap);
	va_end(ap);

	if (retval >= 0) {
		if (buffer) {
			str = buffer;
			free(buffer);
		} else {
			str.clear();
		}
	} else {
		str.clear();
	}

	return retval;
}